

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void init_proc_745(CPUPPCState_conflict2 *env)

{
  int nb_ways;
  undefined8 uVar1;
  CPUPPCState_conflict3 *__mptr;
  int nb_tlbs;
  undefined8 uVar2;
  
  gen_spr_ne_601(env);
  gen_spr_sdr1(env);
  gen_spr_7xx(env);
  gen_spr_G2_755(env);
  gen_tbl(env);
  gen_spr_thrm(env);
  if (((((env->spr_cb[0x3f0].name == (char *)0x0) && (env->spr[0x3f0] == 0)) &&
       (env->spr_cb[0x3f0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      ((env->spr_cb[0x3f0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3f0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
     (env->spr_cb[0x3f0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
    env->spr_cb[0x3f0].name = "HID0";
    env->spr_cb[0x3f0].uea_read = spr_noaccess;
    env->spr_cb[0x3f0].uea_write = spr_noaccess;
    env->spr_cb[0x3f0].oea_read = spr_read_generic;
    env->spr_cb[0x3f0].oea_write = spr_write_generic;
    env->spr_cb[0x3f0].hea_read = spr_read_generic;
    env->spr_cb[0x3f0].hea_write = spr_write_generic;
    env->spr_cb[0x3f0].default_value = 0;
    env->spr[0x3f0] = 0;
    if (((env->spr_cb[0x3f1].name == (char *)0x0) && (env->spr[0x3f1] == 0)) &&
       ((env->spr_cb[0x3f1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3f1].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3f1].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3f1].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3f1].name = "HID1";
      env->spr_cb[0x3f1].uea_read = spr_noaccess;
      env->spr_cb[0x3f1].uea_write = spr_noaccess;
      env->spr_cb[0x3f1].oea_read = spr_read_generic;
      env->spr_cb[0x3f1].oea_write = spr_write_generic;
      env->spr_cb[0x3f1].hea_read = spr_read_generic;
      env->spr_cb[0x3f1].hea_write = spr_write_generic;
      env->spr_cb[0x3f1].default_value = 0;
      env->spr[0x3f1] = 0;
      if ((((env->spr_cb[0x3f3].name == (char *)0x0) && (env->spr[0x3f3] == 0)) &&
          ((env->spr_cb[0x3f3].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3f3].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3f3].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))))) &&
         (env->spr_cb[0x3f3].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
        nb_tlbs = 0xdadd29;
        env->spr_cb[0x3f3].name = "HID2";
        env->spr_cb[0x3f3].uea_read = spr_noaccess;
        env->spr_cb[0x3f3].uea_write = spr_noaccess;
        env->spr_cb[0x3f3].oea_read = spr_read_generic;
        env->spr_cb[0x3f3].oea_write = spr_write_generic;
        env->spr_cb[0x3f3].hea_read = spr_read_generic;
        env->spr_cb[0x3f3].hea_write = spr_write_generic;
        env->spr_cb[0x3f3].default_value = 0;
        env->spr[0x3f3] = 0;
        gen_low_BATs(env);
        gen_high_BATs(env);
        gen_6xx_7xx_soft_tlb(env,nb_tlbs,nb_ways);
        env->excp_vectors[0x40] = 0x100;
        env->excp_vectors[1] = 0x200;
        env->excp_vectors[2] = 0x300;
        env->excp_vectors[3] = 0x400;
        env->excp_vectors[4] = 0x500;
        env->excp_vectors[5] = 0x600;
        env->excp_vectors[6] = 0x700;
        env->excp_vectors[7] = 0x800;
        env->excp_vectors[10] = 0x900;
        env->excp_vectors[8] = 0xc00;
        env->excp_vectors[0x44] = 0xd00;
        env->excp_vectors[0x55] = 0xf00;
        env->excp_vectors[0x4e] = 0x1000;
        env->excp_vectors[0x4f] = 0x1100;
        env->excp_vectors[0x50] = 0x1200;
        env->excp_vectors[0x53] = 0x1300;
        env->excp_vectors[0x54] = 0x1400;
        env->excp_vectors[0x56] = 0x1700;
        env->hreset_vector = 0x100;
        env->dcache_line_size = 0x20;
        env->icache_line_size = 0x20;
        ppc6xx_irq_init_ppc64((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
        return;
      }
      uVar2 = 0x3f3;
      uVar1 = 0x3f3;
    }
    else {
      uVar2 = 0x3f1;
      uVar1 = 0x3f1;
    }
  }
  else {
    uVar2 = 0x3f0;
    uVar1 = 0x3f0;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void init_proc_745(CPUPPCState *env)
{
    gen_spr_ne_601(env);
    gen_spr_sdr1(env);
    gen_spr_7xx(env);
    gen_spr_G2_755(env);
    /* Time base */
    gen_tbl(env);
    /* Thermal management */
    gen_spr_thrm(env);
    /* Hardware implementation registers */
    /* XXX : not implemented */
    spr_register(env, SPR_HID0, "HID0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_HID1, "HID1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_HID2, "HID2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Memory management */
    gen_low_BATs(env);
    gen_high_BATs(env);
    gen_6xx_7xx_soft_tlb(env, 64, 2);
    init_excp_7x5(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc6xx_irq_init(env_archcpu(env));
}